

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

optional<pbrt::RGB> __thiscall
pbrt::ParameterDictionary::GetOneRGB(ParameterDictionary *this,string *name)

{
  ParsedParameter *pPVar1;
  __type_conflict _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_t sVar4;
  const_reference pvVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  optional<pbrt::RGB> *in_RDI;
  optional<pbrt::RGB> oVar7;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  RGB *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  value_type r;
  undefined4 in_stack_ffffffffffffffa4;
  value_type g;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  fmt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::begin(in_RSI);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
         ::end((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  do {
    if (fmt == args) {
      memset(in_RDI,0,0x10);
      pstd::optional<pbrt::RGB>::optional(in_RDI);
      uVar6 = extraout_RDX_00;
LAB_004de834:
      oVar7._8_8_ = uVar6;
      oVar7.optionalValue._0_8_ = in_RDI;
      return oVar7;
    }
    pPVar1 = *(ParsedParameter **)fmt;
    _Var2 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if ((_Var2) &&
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (char *)in_stack_ffffffffffffff98), bVar3)) {
      sVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(&pPVar1->floats);
      if (sVar4 < 3) {
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)fmt,args);
      }
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&pPVar1->floats,0);
      r = *pvVar5;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&pPVar1->floats,1);
      g = *pvVar5;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&pPVar1->floats,2);
      RGB::RGB((RGB *)&stack0xffffffffffffffbc,r,g,*pvVar5);
      pstd::optional<pbrt::RGB>::optional
                ((optional<pbrt::RGB> *)CONCAT44(g,r),in_stack_ffffffffffffff98);
      uVar6 = extraout_RDX;
      goto LAB_004de834;
    }
    fmt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &fmt->_M_string_length;
  } while( true );
}

Assistant:

pstd::optional<RGB> ParameterDictionary::GetOneRGB(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->floats.size() < 3)
                ErrorExit(&p->loc, "Insufficient values for \"rgb\" parameter \"%s\".",
                          p->name);
            return RGB(p->floats[0], p->floats[1], p->floats[2]);
        }
    }
    return {};
}